

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O1

int xmlNanoFTPGetSocket(void *ctx,char *filename)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  char buf [300];
  char local_158 [299];
  undefined1 local_2d;
  
  if (ctx == (void *)0x0) {
    return -1;
  }
  if ((filename == (char *)0x0) && (*(long *)((long)ctx + 0x18) == 0)) {
    return -1;
  }
  iVar1 = xmlNanoFTPGetConnection(ctx);
  *(int *)((long)ctx + 0x48) = iVar1;
  if (iVar1 == -1) {
    return -1;
  }
  builtin_strncpy(local_158,"TYPE I\r\n",9);
  sVar3 = strlen(local_158);
  sVar4 = send(*(int *)((long)ctx + 0x44),local_158,(long)(int)sVar3,0);
  if ((int)sVar4 < 0) {
LAB_0015745d:
    __xmlIOErr(9,0,"send failed");
  }
  else {
    iVar1 = xmlNanoFTPReadResponse(ctx);
    if (iVar1 == 2) {
      snprintf(local_158,300,"RETR %s\r\n");
      local_2d = 0;
      sVar3 = strlen(local_158);
      sVar4 = send(*(int *)((long)ctx + 0x44),local_158,(long)(int)sVar3,0);
      if (-1 < (int)sVar4) {
        iVar2 = xmlNanoFTPReadResponse(ctx);
        iVar1 = *(int *)((long)ctx + 0x48);
        if (iVar2 == 1) {
          return iVar1;
        }
        goto LAB_00157473;
      }
      goto LAB_0015745d;
    }
  }
  iVar1 = *(int *)((long)ctx + 0x48);
LAB_00157473:
  close(iVar1);
  *(undefined4 *)((long)ctx + 0x48) = 0xffffffff;
  return -1;
}

Assistant:

SOCKET
xmlNanoFTPGetSocket(void *ctx, const char *filename) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[300];
    int res, len;
    if (ctx == NULL)
	return INVALID_SOCKET;
    if ((filename == NULL) && (ctxt->path == NULL))
	return INVALID_SOCKET;
    ctxt->dataFd = xmlNanoFTPGetConnection(ctxt);
    if (ctxt->dataFd == INVALID_SOCKET)
	return INVALID_SOCKET;

    snprintf(buf, sizeof(buf), "TYPE I\r\n");
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    res = xmlNanoFTPReadResponse(ctxt);
    if (res != 2) {
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    if (filename == NULL)
	snprintf(buf, sizeof(buf), "RETR %s\r\n", ctxt->path);
    else
	snprintf(buf, sizeof(buf), "RETR %s\r\n", filename);
    buf[sizeof(buf) - 1] = 0;
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    res = xmlNanoFTPReadResponse(ctxt);
    if (res != 1) {
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    return(ctxt->dataFd);
}